

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

IT_PLAYING * dup_playing(IT_PLAYING *src,IT_CHANNEL *dstchannel,IT_CHANNEL *srcchannel)

{
  int iVar1;
  void *pvVar2;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  IT_PLAYING *dst;
  IT_PLAYING *local_8;
  
  if (in_RDI == (int *)0x0) {
    local_8 = (IT_PLAYING *)0x0;
  }
  else {
    local_8 = (IT_PLAYING *)malloc(0x128);
    if (local_8 == (IT_PLAYING *)0x0) {
      local_8 = (IT_PLAYING *)0x0;
    }
    else {
      local_8->flags = *in_RDI;
      local_8->resampling_quality = in_RDI[1];
      local_8->channel = (IT_CHANNEL *)(in_RSI + ((*(long *)(in_RDI + 2) - in_RDX) / 0xa0) * 0xa0);
      local_8->sample = *(IT_SAMPLE **)(in_RDI + 4);
      local_8->instrument = *(IT_INSTRUMENT **)(in_RDI + 6);
      local_8->env_instrument = *(IT_INSTRUMENT **)(in_RDI + 8);
      local_8->sampnum = *(unsigned_short *)(in_RDI + 10);
      local_8->instnum = *(uchar *)((long)in_RDI + 0x2a);
      local_8->declick_stage = *(uchar *)((long)in_RDI + 0x2b);
      local_8->float_volume[0] = (float)in_RDI[0xb];
      local_8->float_volume[1] = (float)in_RDI[0xc];
      local_8->ramp_volume[0] = (float)in_RDI[0xd];
      local_8->ramp_volume[1] = (float)in_RDI[0xe];
      local_8->ramp_delta[0] = (float)in_RDI[0xf];
      local_8->ramp_delta[1] = (float)in_RDI[0x10];
      local_8->channel_volume = (uchar)in_RDI[0x11];
      local_8->volume = *(uchar *)((long)in_RDI + 0x45);
      local_8->pan = *(unsigned_short *)((long)in_RDI + 0x46);
      local_8->volume_offset = (char)in_RDI[0x12];
      local_8->panning_offset = *(char *)((long)in_RDI + 0x49);
      local_8->note = *(uchar *)((long)in_RDI + 0x4a);
      local_8->enabled_envelopes = *(uchar *)((long)in_RDI + 0x4b);
      local_8->filter_cutoff = (uchar)in_RDI[0x13];
      local_8->filter_resonance = *(uchar *)((long)in_RDI + 0x4d);
      local_8->true_filter_cutoff = *(unsigned_short *)((long)in_RDI + 0x4e);
      local_8->true_filter_resonance = (uchar)in_RDI[0x14];
      local_8->vibrato_speed = *(uchar *)((long)in_RDI + 0x51);
      local_8->vibrato_depth = *(uchar *)((long)in_RDI + 0x52);
      local_8->vibrato_n = *(uchar *)((long)in_RDI + 0x53);
      local_8->vibrato_time = (uchar)in_RDI[0x15];
      local_8->vibrato_waveform = *(uchar *)((long)in_RDI + 0x55);
      local_8->tremolo_speed = *(uchar *)((long)in_RDI + 0x56);
      local_8->tremolo_depth = *(uchar *)((long)in_RDI + 0x57);
      local_8->tremolo_time = (uchar)in_RDI[0x16];
      local_8->tremolo_waveform = *(uchar *)((long)in_RDI + 0x59);
      local_8->panbrello_speed = *(uchar *)((long)in_RDI + 0x5a);
      local_8->panbrello_depth = *(uchar *)((long)in_RDI + 0x5b);
      local_8->panbrello_time = (uchar)in_RDI[0x17];
      local_8->panbrello_waveform = *(uchar *)((long)in_RDI + 0x5d);
      local_8->panbrello_random = *(char *)((long)in_RDI + 0x5e);
      local_8->sample_vibrato_time = *(uchar *)((long)in_RDI + 0x5f);
      local_8->sample_vibrato_waveform = (uchar)in_RDI[0x18];
      local_8->sample_vibrato_depth = in_RDI[0x19];
      local_8->slide = in_RDI[0x1a];
      local_8->delta = (float)in_RDI[0x1b];
      local_8->finetune = in_RDI[0x1c];
      iVar1 = in_RDI[0x1e];
      (local_8->volume_envelope).next_node = in_RDI[0x1d];
      (local_8->volume_envelope).tick = iVar1;
      (local_8->volume_envelope).value = in_RDI[0x1f];
      iVar1 = in_RDI[0x21];
      (local_8->pan_envelope).next_node = in_RDI[0x20];
      (local_8->pan_envelope).tick = iVar1;
      (local_8->pan_envelope).value = in_RDI[0x22];
      iVar1 = in_RDI[0x24];
      (local_8->pitch_envelope).next_node = in_RDI[0x23];
      (local_8->pitch_envelope).tick = iVar1;
      (local_8->pitch_envelope).value = in_RDI[0x25];
      local_8->fadeoutcount = in_RDI[0x26];
      local_8->filter_state[0] = *(IT_FILTER_STATE *)(in_RDI + 0x27);
      local_8->filter_state[1] = *(IT_FILTER_STATE *)(in_RDI + 0x29);
      memcpy(&local_8->resampler,in_RDI + 0x2c,0x68);
      (local_8->resampler).pickup_data = local_8;
      (local_8->resampler).fir_resampler_ratio = *(double *)(in_RDI + 0x40);
      pvVar2 = resampler_dup(local_8);
      (local_8->resampler).fir_resampler[0] = pvVar2;
      if ((local_8->resampler).fir_resampler[0] == (void *)0x0) {
        free(local_8);
        local_8 = (IT_PLAYING *)0x0;
      }
      else {
        pvVar2 = resampler_dup(local_8);
        (local_8->resampler).fir_resampler[1] = pvVar2;
        if ((local_8->resampler).fir_resampler[1] == (void *)0x0) {
          resampler_delete((void *)0x9baf9e);
          free(local_8);
          local_8 = (IT_PLAYING *)0x0;
        }
        else {
          local_8->time_lost = in_RDI[0x46];
        }
      }
    }
  }
  return local_8;
}

Assistant:

static IT_PLAYING *dup_playing(IT_PLAYING *src, IT_CHANNEL *dstchannel, IT_CHANNEL *srcchannel)
{
	IT_PLAYING *dst;

	if (!src) return NULL;

	dst = malloc(sizeof(*dst));
	if (!dst) return NULL;

	dst->flags = src->flags;
	dst->resampling_quality = src->resampling_quality;

	ASSERT(src->channel);
	dst->channel = &dstchannel[src->channel - srcchannel];
	dst->sample = src->sample;
	dst->instrument = src->instrument;
	dst->env_instrument = src->env_instrument;

	dst->sampnum = src->sampnum;
	dst->instnum = src->instnum;

	dst->declick_stage = src->declick_stage;

	dst->float_volume[0] = src->float_volume[0];
	dst->float_volume[1] = src->float_volume[1];

	dst->ramp_volume[0] = src->ramp_volume[0];
	dst->ramp_volume[1] = src->ramp_volume[1];

	dst->ramp_delta[0] = src->ramp_delta[0];
	dst->ramp_delta[1] = src->ramp_delta[1];

	dst->channel_volume = src->channel_volume;

	dst->volume = src->volume;
	dst->pan = src->pan;

	dst->volume_offset = src->volume_offset;
	dst->panning_offset = src->panning_offset;

	dst->note = src->note;

	dst->enabled_envelopes = src->enabled_envelopes;

	dst->filter_cutoff = src->filter_cutoff;
	dst->filter_resonance = src->filter_resonance;

	dst->true_filter_cutoff = src->true_filter_cutoff;
	dst->true_filter_resonance = src->true_filter_resonance;

	dst->vibrato_speed = src->vibrato_speed;
	dst->vibrato_depth = src->vibrato_depth;
	dst->vibrato_n = src->vibrato_n;
	dst->vibrato_time = src->vibrato_time;
	dst->vibrato_waveform = src->vibrato_waveform;

	dst->tremolo_speed = src->tremolo_speed;
	dst->tremolo_depth = src->tremolo_depth;
	dst->tremolo_time = src->tremolo_time;
	dst->tremolo_waveform = src->tremolo_waveform;

	dst->panbrello_speed = src->panbrello_speed;
	dst->panbrello_depth = src->panbrello_depth;
	dst->panbrello_time = src->panbrello_time;
	dst->panbrello_waveform = src->panbrello_waveform;
	dst->panbrello_random = src->panbrello_random;

	dst->sample_vibrato_time = src->sample_vibrato_time;
	dst->sample_vibrato_waveform = src->sample_vibrato_waveform;
	dst->sample_vibrato_depth = src->sample_vibrato_depth;

	dst->slide = src->slide;
	dst->delta = src->delta;
	dst->finetune = src->finetune;

	dst->volume_envelope = src->volume_envelope;
	dst->pan_envelope = src->pan_envelope;
	dst->pitch_envelope = src->pitch_envelope;

	dst->fadeoutcount = src->fadeoutcount;

	dst->filter_state[0] = src->filter_state[0];
	dst->filter_state[1] = src->filter_state[1];

	dst->resampler = src->resampler;
	dst->resampler.pickup_data = dst;
	dst->resampler.fir_resampler_ratio = src->resampler.fir_resampler_ratio;
	dst->resampler.fir_resampler[0] = resampler_dup( src->resampler.fir_resampler[0] );
	if ( !dst->resampler.fir_resampler[0] ) {
		free( dst );
		return NULL;
	}
	dst->resampler.fir_resampler[1] = resampler_dup( src->resampler.fir_resampler[1] );
	if ( !dst->resampler.fir_resampler[1] ) {
		resampler_delete( dst->resampler.fir_resampler[0] );
		free( dst );
		return NULL;
	}
	dst->time_lost = src->time_lost;

	//dst->output = src->output;

	return dst;
}